

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O1

SslTcpSocket * __thiscall
SslTcpServerImpl::MakeClientConnection(SslTcpServerImpl *this,int32_t *fSock)

{
  pointer ctx;
  BaseSocket *pBVar1;
  int iVar2;
  BaseSocket *pBVar3;
  BaseSocketImpl *pBVar4;
  SslTcpSocketImpl *pSVar5;
  SslConnection *pSVar6;
  TcpServer *pTVar7;
  void *pVoid;
  pointer __p;
  SslTcpSocketImpl *pSslTcpSocketImpl;
  unique_ptr<BaseSocket,_std::default_delete<BaseSocket>_> pSslTcpSocket;
  SslTcpSocketImpl *local_a0;
  _Head_base<0UL,_BaseSocket_*,_false> local_98;
  thread local_90;
  _Any_data local_88;
  _Alloc_hider local_78;
  _Invoker_type p_Stack_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  
  if ((this->m_SslCtx).
      super__Vector_base<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->m_SslCtx).
      super__Vector_base<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    OpenSSLWrapper::SslServerContext::SslServerContext((SslServerContext *)&local_88);
    std::vector<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>
    ::emplace_back<OpenSSLWrapper::SslServerContext>(&this->m_SslCtx,(SslServerContext *)&local_88);
    local_88._M_unused._M_object = &PTR__SslServerContext_001470d8;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_40);
    OpenSSLWrapper::SslContext::~SslContext((SslContext *)&local_88);
  }
  pBVar3 = (BaseSocket *)operator_new(0x10);
  SslTcpSocket::SslTcpSocket((SslTcpSocket *)pBVar3);
  pSVar5 = (SslTcpSocketImpl *)0x0;
  local_98._M_head_impl = pBVar3;
  pBVar3 = (BaseSocket *)__dynamic_cast(pBVar3,&BaseSocket::typeinfo,&SslTcpSocket::typeinfo,0);
  pBVar4 = BaseSocket::GetImpl(pBVar3);
  if (pBVar4 != (BaseSocketImpl *)0x0) {
    pSVar5 = (SslTcpSocketImpl *)
             __dynamic_cast(pBVar4,&BaseSocketImpl::typeinfo,&SslTcpSocketImpl::typeinfo,0);
  }
  ctx = (this->m_SslCtx).
        super__Vector_base<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>
        ._M_impl.super__Vector_impl_data._M_start;
  local_a0 = pSVar5;
  pSVar6 = (SslConnection *)operator_new(0x70);
  OpenSSLWrapper::SslConnection::SslConnection(pSVar6,&ctx->super_SslContext);
  local_88._M_unused._M_object = (void *)0x0;
  std::
  __uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
  ::reset((__uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
           *)&local_a0->m_pSslCon,pSVar6);
  std::
  unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>::
  ~unique_ptr((unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
               *)&local_88);
  (local_a0->super_TcpSocketImpl).super_BaseSocketImpl.m_fSock = *fSock;
  LOCK();
  (local_a0->super_TcpSocketImpl).super_BaseSocketImpl.m_iShutDownState.
  super___atomic_base<unsigned_char>._M_i = '\a';
  UNLOCK();
  pBVar1 = (this->super_TcpServerImpl).super_BaseSocketImpl.m_pBkRef;
  if (pBVar1 == (BaseSocket *)0x0) {
    pTVar7 = (TcpServer *)0x0;
  }
  else {
    pTVar7 = (TcpServer *)__dynamic_cast(pBVar1,&BaseSocket::typeinfo,&SslTcpServer::typeinfo,0);
  }
  (local_a0->super_TcpSocketImpl).m_pRefServSocket = pTVar7;
  local_88._M_unused._M_object = TcpSocketImpl::WriteThread;
  local_88._8_8_ = (SSL_CTX *)0x0;
  std::thread::thread<void(TcpSocketImpl::*)(),SslTcpSocketImpl*&,void>
            (&local_90,(offset_in_TcpSocketImpl_to_subr *)local_88._M_pod_data,&local_a0);
  pSVar5 = local_a0;
  if ((local_a0->super_TcpSocketImpl).super_BaseSocketImpl.m_thWrite._M_id._M_thread == 0) {
    (local_a0->super_TcpSocketImpl).super_BaseSocketImpl.m_thWrite._M_id._M_thread =
         (native_handle_type)local_90._M_id._M_thread;
    pSVar6 = (local_a0->m_pSslCon)._M_t.
             super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             ._M_t.
             super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl;
    local_78._M_p = (pointer)0x0;
    p_Stack_70 = (_Invoker_type)0x0;
    local_88._M_unused._M_object = (void *)0x0;
    local_88._8_8_ = (SSL_CTX *)0x0;
    local_88._M_unused._M_object = operator_new(0x18);
    ((SslConnection *)local_88._M_unused._0_8_)->m_ssl = (SSL *)0x11;
    ((SslConnection *)local_88._M_unused._0_8_)->m_rbio = (BIO *)0x0;
    ((SslConnection *)local_88._M_unused._0_8_)->m_wbio = (BIO *)pSVar5;
    p_Stack_70 = std::
                 _Function_handler<void_(),_std::_Bind<void_(BaseSocketImpl::*(SslTcpSocketImpl_*))()>_>
                 ::_M_invoke;
    local_78._M_p =
         (pointer)std::
                  _Function_handler<void_(),_std::_Bind<void_(BaseSocketImpl::*(SslTcpSocketImpl_*))()>_>
                  ::_M_manager;
    OpenSSLWrapper::SslConnection::SetErrorCb(pSVar6,(function<void_()> *)&local_88);
    if ((code *)local_78._M_p != (code *)0x0) {
      (*(code *)local_78._M_p)(&local_88,&local_88,3);
    }
    pVoid = (void *)0x0;
    OpenSSLWrapper::SslConnection::SetUserData
              ((local_a0->m_pSslCon)._M_t.
               super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
               ._M_t.
               super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
               .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl,0,
               SslTcpSocketImpl::fnForwarder_abi_cxx11_);
    pSVar6 = (local_a0->m_pSslCon)._M_t.
             super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             ._M_t.
             super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl;
    pBVar4 = BaseSocket::GetImpl(pBVar3);
    if (pBVar4 != (BaseSocketImpl *)0x0) {
      pVoid = (void *)__dynamic_cast(pBVar4,&BaseSocketImpl::typeinfo,&SslTcpSocketImpl::typeinfo,0)
      ;
    }
    OpenSSLWrapper::SslConnection::SetUserData(pSVar6,1,pVoid);
    local_88._M_unused._M_object = SslTcpSocketImpl::DatenEncode;
    local_88._8_8_ = (SSL_CTX *)0x0;
    local_78._M_p = (pointer)local_a0;
    std::function<int(unsigned_char_const*,unsigned_long)>::operator=
              ((function<int(unsigned_char_const*,unsigned_long)> *)
               &(local_a0->super_TcpSocketImpl).m_fnSslEncode,
               (_Bind<int_(SslTcpSocketImpl::*(SslTcpSocketImpl_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_unsigned_char_*,_unsigned_long)>
                *)&local_88);
    local_88._M_unused._M_object = SslTcpSocketImpl::DatenDecode;
    local_88._8_8_ = (SSL_CTX *)0x0;
    local_78._M_p = (pointer)local_a0;
    std::function<int(unsigned_char_const*,unsigned_long,bool&)>::operator=
              ((function<int(unsigned_char_const*,unsigned_long,bool&)> *)
               &(local_a0->super_TcpSocketImpl).m_fnSslDecode,
               (_Bind<int_(SslTcpSocketImpl::*(SslTcpSocketImpl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(const_unsigned_char_*,_unsigned_long,_bool_&)>
                *)&local_88);
    OpenSSLWrapper::SslConnection::SSLSetAcceptState
              ((local_a0->m_pSslCon)._M_t.
               super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
               ._M_t.
               super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
               .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl);
    (*(local_a0->super_TcpSocketImpl).super_BaseSocketImpl._vptr_BaseSocketImpl[0xe])
              (local_a0,fSock);
    TcpSocketImpl::GetConnectionInfo(&local_a0->super_TcpSocketImpl);
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)&BaseSocketImpl::s_mxClientSocket);
    if (iVar2 == 0) {
      std::
      deque<std::unique_ptr<BaseSocket,std::default_delete<BaseSocket>>,std::allocator<std::unique_ptr<BaseSocket,std::default_delete<BaseSocket>>>>
      ::emplace_back<std::unique_ptr<BaseSocket,std::default_delete<BaseSocket>>>
                ((deque<std::unique_ptr<BaseSocket,std::default_delete<BaseSocket>>,std::allocator<std::unique_ptr<BaseSocket,std::default_delete<BaseSocket>>>>
                  *)&BaseSocketImpl::s_lstClientSocket,
                 (unique_ptr<BaseSocket,_std::default_delete<BaseSocket>_> *)&local_98);
      pthread_mutex_unlock((pthread_mutex_t *)&BaseSocketImpl::s_mxClientSocket);
      if (local_98._M_head_impl != (BaseSocket *)0x0) {
        (*(((TcpSocket *)&(local_98._M_head_impl)->_vptr_BaseSocket)->super_BaseSocket).
          _vptr_BaseSocket[1])();
      }
      return (SslTcpSocket *)pBVar3;
    }
    std::__throw_system_error(iVar2);
  }
  std::terminate();
}

Assistant:

SslTcpSocket* SslTcpServerImpl::MakeClientConnection(const SOCKET& fSock)
{
    if (m_SslCtx.size() == 0)
        m_SslCtx.emplace_back(SslServerContext());

    unique_ptr<BaseSocket> pSslTcpSocket = make_unique<SslTcpSocket>();
    SslTcpSocket* pSslTcpSock = dynamic_cast<SslTcpSocket*>(pSslTcpSocket.get());
    SslTcpSocketImpl* pSslTcpSocketImpl = dynamic_cast<SslTcpSocketImpl*>(pSslTcpSock->GetImpl());

    try
    {
        pSslTcpSocketImpl->m_pSslCon = make_unique<SslConnection>(m_SslCtx.front());

        pSslTcpSocketImpl->m_fSock = fSock;
        pSslTcpSocketImpl->m_iShutDownState = 7;
        pSslTcpSocketImpl->m_pRefServSocket = dynamic_cast<SslTcpServer*>(m_pBkRef);
        pSslTcpSocketImpl->m_thWrite = thread(&TcpSocketImpl::WriteThread, pSslTcpSocketImpl);

        pSslTcpSocketImpl->m_pSslCon->SetErrorCb(function<void()>(bind(&BaseSocketImpl::Close, pSslTcpSocketImpl)));
        pSslTcpSocketImpl->m_pSslCon->SetUserData(0, reinterpret_cast<void*>(&SslTcpSocketImpl::fnForwarder));
        pSslTcpSocketImpl->m_pSslCon->SetUserData(1, dynamic_cast<SslTcpSocketImpl*>(pSslTcpSock->GetImpl()));
        pSslTcpSocketImpl->m_fnSslEncode = bind(&SslTcpSocketImpl::DatenEncode, pSslTcpSocketImpl, _1, _2);
        pSslTcpSocketImpl->m_fnSslDecode = bind(&SslTcpSocketImpl::DatenDecode, pSslTcpSocketImpl, _1, _2, _3);

        pSslTcpSocketImpl->m_pSslCon->SSLSetAcceptState();

        pSslTcpSocketImpl->SetSocketOption(fSock);
        pSslTcpSocketImpl->GetConnectionInfo();
    }

    catch (const int iErrNo)
    {
        pSslTcpSocketImpl->SetErrorNo(iErrNo);
    }

    lock_guard<mutex> lock(s_mxClientSocket);
    s_lstClientSocket.push_back(move(pSslTcpSocket));

    return pSslTcpSock;
}